

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDistance.cpp
# Opt level: O1

int __thiscall
chrono::ChLinkDistance::Initialize
          (ChLinkDistance *this,shared_ptr<chrono::ChBodyFrame> *mbody1,
          shared_ptr<chrono::ChBodyFrame> *mbody2,bool pos_are_relative,ChVector<double> *mpos1,
          ChVector<double> *mpos2,bool auto_distance,double mdistance)

{
  element_type *peVar1;
  ChBodyFrame *pCVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000009;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_48;
  double local_40;
  double local_38;
  
  peVar1 = (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->super_ChLink).Body1 = peVar1;
  (this->super_ChLink).Body2 =
       (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58 = mdistance;
  iVar3 = (*(peVar1->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar4 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->Cx,(ChVariables *)CONCAT44(extraout_var,iVar3),
             (ChVariables *)CONCAT44(extraout_var_00,iVar4));
  if ((int)CONCAT71(in_register_00000009,pos_are_relative) == 0) {
    pCVar2 = (this->super_ChLink).Body1;
    ChTransform<double>::TransformParentToLocal
              (mpos1,&(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
               &(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
    if ((ChVector<double> *)&local_70 != &this->pos1) {
      (this->pos1).m_data[0] = local_70;
      (this->pos1).m_data[1] = local_68;
      (this->pos1).m_data[2] = local_60;
    }
    pCVar2 = (this->super_ChLink).Body2;
    ChTransform<double>::TransformParentToLocal
              (mpos2,&(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
               &(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
    if ((ChVector<double> *)&local_70 == &this->pos2) goto LAB_005873a2;
    (this->pos2).m_data[0] = local_70;
    (this->pos2).m_data[1] = local_68;
    dVar6 = local_60;
  }
  else {
    if (&this->pos1 != mpos1) {
      (this->pos1).m_data[0] = mpos1->m_data[0];
      (this->pos1).m_data[1] = mpos1->m_data[1];
      (this->pos1).m_data[2] = mpos1->m_data[2];
    }
    if (&this->pos2 == mpos2) goto LAB_005873a2;
    (this->pos2).m_data[0] = mpos2->m_data[0];
    (this->pos2).m_data[1] = mpos2->m_data[1];
    dVar6 = mpos2->m_data[2];
  }
  (this->pos2).m_data[2] = dVar6;
LAB_005873a2:
  pCVar2 = (this->super_ChLink).Body1;
  ChTransform<double>::TransformLocalToParent
            (&this->pos1,&(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  pCVar2 = (this->super_ChLink).Body2;
  ChTransform<double>::TransformLocalToParent
            (&this->pos2,&(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (local_68 - local_40) * (local_68 - local_40);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_70 - local_48;
  auVar7 = vfmadd231sd_fma(auVar7,auVar9,auVar9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_60 - local_38;
  auVar7 = vfmadd231sd_fma(auVar7,auVar8,auVar8);
  if (auVar7._0_8_ < 0.0) {
    dVar6 = sqrt(auVar7._0_8_);
  }
  else {
    auVar7 = vsqrtsd_avx(auVar7,auVar7);
    dVar6 = auVar7._0_8_;
  }
  this->curr_dist = dVar6;
  dVar5 = (double)((ulong)auto_distance * (long)dVar6 + (ulong)!auto_distance * (long)local_58);
  this->distance = dVar5;
  (this->C).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
       dVar6 - dVar5;
  return 1;
}

Assistant:

int ChLinkDistance::Initialize(std::shared_ptr<ChBodyFrame> mbody1,
                               std::shared_ptr<ChBodyFrame> mbody2,
                               bool pos_are_relative,
                               ChVector<> mpos1,
                               ChVector<> mpos2,
                               bool auto_distance,
                               double mdistance) {
    Body1 = mbody1.get();
    Body2 = mbody2.get();
    Cx.SetVariables(&Body1->Variables(), &Body2->Variables());

    if (pos_are_relative) {
        pos1 = mpos1;
        pos2 = mpos2;
    } else {
        pos1 = Body1->TransformPointParentToLocal(mpos1);
        pos2 = Body2->TransformPointParentToLocal(mpos2);
    }

    ChVector<> AbsDist = Body1->TransformPointLocalToParent(pos1) - Body2->TransformPointLocalToParent(pos2);
    curr_dist = AbsDist.Length();

    if (auto_distance) {
        distance = curr_dist;
    } else {
        distance = mdistance;
    }

    C[0] = curr_dist - distance;

    return true;
}